

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varinfo.c
# Opt level: O0

varinfo * varinfo_new(vardata *data)

{
  varinfo *pvVar1;
  uint32_t *puVar2;
  int *piVar3;
  int local_1c;
  int i;
  varinfo *res;
  vardata *data_local;
  
  pvVar1 = (varinfo *)calloc(0x20,1);
  pvVar1->data = data;
  puVar2 = mask_new(data->featuresnum);
  pvVar1->fmask = puVar2;
  piVar3 = (int *)calloc(4,(long)data->varsetsnum);
  pvVar1->variants = piVar3;
  for (local_1c = 0; local_1c < data->varsetsnum; local_1c = local_1c + 1) {
    pvVar1->variants[local_1c] = -1;
  }
  piVar3 = (int *)calloc(4,(long)data->modesetsnum);
  pvVar1->modes = piVar3;
  for (local_1c = 0; local_1c < data->modesetsnum; local_1c = local_1c + 1) {
    pvVar1->modes[local_1c] = data->modesets[local_1c].defmode;
  }
  return pvVar1;
}

Assistant:

struct varinfo *varinfo_new(struct vardata *data) {
	struct varinfo *res = calloc(sizeof *res, 1);
	int i;
	res->data = data;
	res->fmask = mask_new(data->featuresnum);
	res->variants = calloc(sizeof *res->variants, data->varsetsnum);
	for (i = 0; i < data->varsetsnum; i++)
		res->variants[i] = -1;
	res->modes = calloc(sizeof *res->modes, data->modesetsnum);
	for (i = 0; i < data->modesetsnum; i++)
		res->modes[i] = data->modesets[i].defmode;
	return res;
}